

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Client __thiscall capnp::MembranePolicy::importExternal(MembranePolicy *this,Client *external)

{
  uint *puVar1;
  MembranePolicy *pMVar2;
  ClientHook *pCVar3;
  Refcounted *refcounted;
  MembraneHook *this_00;
  undefined4 *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *pCVar4;
  Client CVar5;
  Own<capnp::MembranePolicy,_std::nullptr_t> local_30;
  Own<capnp::ClientHook,_std::nullptr_t> local_20;
  
  local_20.disposer._0_4_ = *in_RDX;
  local_20.disposer._4_4_ = in_RDX[1];
  local_20.ptr = *(ClientHook **)(in_RDX + 2);
  *(undefined8 *)(in_RDX + 2) = 0;
  (*(code *)(external->hook).disposer[2]._vptr_Disposer)(&local_30);
  this_00 = (MembraneHook *)operator_new(0x60);
  MembraneHook::MembraneHook(this_00,&local_20,&local_30,true);
  pMVar2 = local_30.ptr;
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  this->_vptr_MembranePolicy = (_func_int **)&this_00->super_Refcounted;
  (this->wrappers).table.rows.builder.ptr = (Entry *)this_00;
  pCVar4 = extraout_RDX;
  if (local_30.ptr != (MembranePolicy *)0x0) {
    local_30.ptr = (MembranePolicy *)0x0;
    (**(local_30.disposer)->_vptr_Disposer)
              (local_30.disposer,
               (_func_int *)
               ((long)&pMVar2->_vptr_MembranePolicy + (long)pMVar2->_vptr_MembranePolicy[-2]));
    pCVar4 = extraout_RDX_00;
  }
  pCVar3 = local_20.ptr;
  if (local_20.ptr != (ClientHook *)0x0) {
    local_20.ptr = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_20.disposer._4_4_,local_20.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_20.disposer._4_4_,local_20.disposer._0_4_),
               (_func_int *)((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
    pCVar4 = extraout_RDX_01;
  }
  CVar5.hook.ptr = pCVar4;
  CVar5.hook.disposer = (Disposer *)this;
  return (Client)CVar5.hook;
}

Assistant:

Capability::Client MembranePolicy::importExternal(Capability::Client external) {
  return Capability::Client(kj::refcounted<MembraneHook>(
      ClientHook::from(kj::mv(external)), addRef(), true));
}